

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

void GPU_UnsetVirtualResolution(GPU_Target *target)

{
  GPU_Target *pGVar1;
  char *pcVar2;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar2 = "NULL renderer";
    goto LAB_00136b5b;
  }
  pGVar1 = _gpu_current_renderer->current_context_target;
  if (target == (GPU_Target *)0x0 || pGVar1 != (GPU_Target *)0x0) {
LAB_00136b1c:
    if (pGVar1 != (GPU_Target *)0x0) {
      (*_gpu_current_renderer->impl->UnsetVirtualResolution)(_gpu_current_renderer,target);
      return;
    }
  }
  else if (target->context != (GPU_Context *)0x0) {
    (*_gpu_current_renderer->impl->MakeCurrent)
              (_gpu_current_renderer,target,target->context->windowID);
    pGVar1 = _gpu_current_renderer->current_context_target;
    goto LAB_00136b1c;
  }
  pcVar2 = "NULL context";
LAB_00136b5b:
  GPU_PushErrorCode("GPU_UnsetVirtualResolution",GPU_ERROR_USER_ERROR,"%s",pcVar2);
  return;
}

Assistant:

void GPU_UnsetVirtualResolution(GPU_Target* target)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    _gpu_current_renderer->impl->UnsetVirtualResolution(_gpu_current_renderer, target);
}